

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vx-sound.c
# Opt level: O2

void ALnssSleep(unsigned_long nsec)

{
  int iVar1;
  int *piVar2;
  timespec ts;
  timespec rem;
  timespec local_38;
  timespec local_20;
  
  local_38.tv_sec = nsec / 1000000000;
  local_38.tv_nsec = nsec % 1000000000;
  while( true ) {
    iVar1 = nanosleep(&local_38,&local_20);
    if (iVar1 != -1) {
      return;
    }
    piVar2 = __errno_location();
    if (*piVar2 != 4) break;
    local_38.tv_sec = local_20.tv_sec;
    local_38.tv_nsec = local_20.tv_nsec;
  }
  return;
}

Assistant:

void ALnssSleep(unsigned long nsec) {
    struct timespec ts, rem;
    ts.tv_sec = (time_t) (nsec / 1000000000ul);
    ts.tv_nsec = (long) (nsec % 1000000000ul);
    while (nanosleep(&ts, &rem) == -1 && errno == EINTR)
        ts = rem;
}